

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O2

bool NULLCIO::IsPressed(int key)

{
  nullcThrowError("IsPressed: supported only under Windows");
  return false;
}

Assistant:

bool IsPressed(int key)
	{
#if defined(_MSC_VER)
		unsigned char arr[256];
		::GetKeyboardState(arr);
		return !!(arr[key & 0xff] & 0x80);
#elif defined(EMSCRIPTEN)
		int numKeys = 0;
		const Uint8* keys = SDL_GetKeyboardState(&numKeys);

		return key < numKeys ? keys[key] : false;
#else
		(void)key;

		nullcThrowError("IsPressed: supported only under Windows");
		return false;
#endif
	}